

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void __thiscall FBX::Decoder::Decoder(Decoder *this,string *path)

{
  std::__cxx11::string::string((string *)this,(string *)path);
  Stream::Stream(&this->stream,path);
  this->version = 0;
  this->blockLength = 0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->isuInt32 = true;
  return;
}

Assistant:

Decoder::Decoder(const std::string &path) : path(path), stream(path) {}